

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintTwoBodies::ChConstraintTwoBodies
          (ChConstraintTwoBodies *this,ChVariablesBody *mvariables_a,ChVariablesBody *mvariables_b)

{
  (this->super_ChConstraintTwo).super_ChConstraint.valid = false;
  (this->super_ChConstraintTwo).super_ChConstraint.disabled = false;
  (this->super_ChConstraintTwo).super_ChConstraint.redundant = false;
  (this->super_ChConstraintTwo).super_ChConstraint.broken = false;
  (this->super_ChConstraintTwo).super_ChConstraint.c_i = 0.0;
  (this->super_ChConstraintTwo).super_ChConstraint.l_i = 0.0;
  (this->super_ChConstraintTwo).super_ChConstraint.b_i = 0.0;
  (this->super_ChConstraintTwo).super_ChConstraint.cfm_i = 0.0;
  (this->super_ChConstraintTwo).super_ChConstraint.active = true;
  (this->super_ChConstraintTwo).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->super_ChConstraintTwo).super_ChConstraint.g_i = 0.0;
  (this->super_ChConstraintTwo).variables_a = (ChVariables *)SUB168(ZEXT416(0) << 0x40,0);
  (this->super_ChConstraintTwo).variables_b = (ChVariables *)SUB168(ZEXT416(0) << 0x40,8);
  (this->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraint_01186f90;
  Eigen::DenseBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_> *)&this->Cq_a);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_> *)&this->Cq_b);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&this->Eq_a);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&this->Eq_b);
  (*(this->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x15])
            (this,mvariables_a,mvariables_b);
  return;
}

Assistant:

ChConstraintTwoBodies::ChConstraintTwoBodies(ChVariablesBody* mvariables_a, ChVariablesBody* mvariables_b) {
    Cq_a.setZero();
    Cq_b.setZero();
    Eq_a.setZero();
    Eq_b.setZero();
    SetVariables(mvariables_a, mvariables_b);
}